

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_skl_motion::save(xr_skl_motion *this,xr_writer *w)

{
  f_w_const<xray_re::xr_bone_motion> write;
  f_w_const<xray_re::xr_motion_marks> write_00;
  bool bVar1;
  size_type sVar2;
  mem_func in_stack_ffffffffffffff68;
  xr_writer *pxVar3;
  undefined8 in_stack_ffffffffffffff70;
  xr_writer *this_00;
  f_w_const<xray_re::xr_motion_marks> local_48;
  code *local_38;
  undefined8 local_30;
  f_w_const<xray_re::xr_bone_motion> local_28;
  xr_writer *local_18;
  xr_writer *w_local;
  xr_skl_motion *this_local;
  
  local_18 = w;
  w_local = (xr_writer *)this;
  xr_motion::save(&this->super_xr_motion,w);
  pxVar3 = local_18;
  bVar1 = std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::
          empty(&this->m_marks);
  xr_writer::w_u16(pxVar3,bVar1 ^ 7);
  xr_writer::w_u8(local_18,(uint8_t)this->m_flags);
  xr_writer::w_u16(local_18,this->m_bone_or_part);
  xr_writer::w_float(local_18,this->m_speed);
  xr_writer::w_float(local_18,this->m_accrue);
  xr_writer::w_float(local_18,this->m_falloff);
  xr_writer::w_float(local_18,this->m_power);
  pxVar3 = local_18;
  sVar2 = std::vector<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>::size
                    (&this->m_bone_motions);
  xr_writer::w_size_u16(pxVar3,sVar2);
  pxVar3 = local_18;
  local_38 = xr_bone_motion::save;
  local_30 = 0;
  xr_writer::f_w_const<xray_re::xr_bone_motion>::f_w_const(&local_28,0x22a8d0);
  write._8_8_ = in_stack_ffffffffffffff70;
  write.m_f = in_stack_ffffffffffffff68;
  xr_writer::
  w_seq<std::vector<xray_re::xr_bone_motion*,std::allocator<xray_re::xr_bone_motion*>>,xray_re::xr_writer::f_w_const<xray_re::xr_bone_motion>>
            (pxVar3,&this->m_bone_motions,write);
  bVar1 = std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::
          empty(&this->m_marks);
  if (!bVar1) {
    pxVar3 = local_18;
    sVar2 = std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::
            size(&this->m_marks);
    xr_writer::w_size_u32(pxVar3,sVar2);
    this_00 = local_18;
    xr_writer::f_w_const<xray_re::xr_motion_marks>::f_w_const(&local_48,0x22a990);
    write_00._8_8_ = this_00;
    write_00.m_f = (mem_func)pxVar3;
    xr_writer::
    w_seq<std::vector<xray_re::xr_motion_marks*,std::allocator<xray_re::xr_motion_marks*>>,xray_re::xr_writer::f_w_const<xray_re::xr_motion_marks>>
              (this_00,&this->m_marks,write_00);
  }
  return;
}

Assistant:

void xr_skl_motion::save(xr_writer& w) const
{
	xr_motion::save(w);
	w.w_u16(m_marks.empty()? SMOTION_VERSION_6 : SMOTION_VERSION_7);
	w.w_u8(uint8_t(m_flags & 0xff));
	w.w_u16(m_bone_or_part);
	w.w_float(m_speed);
	w.w_float(m_accrue);
	w.w_float(m_falloff);
	w.w_float(m_power);
	w.w_size_u16(m_bone_motions.size());
	w.w_seq(m_bone_motions, xr_writer::f_w_const<xr_bone_motion>(&xr_bone_motion::save));
	
	// save marks
	if (!m_marks.empty()) {
		w.w_size_u32(m_marks.size());
		w.w_seq(m_marks, xr_writer::f_w_const<xr_motion_marks>(&xr_motion_marks::save));
	}
}